

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_panel.cxx
# Opt level: O2

Fl_Double_Window * make_data_panel(void)

{
  Fl_Input *pFVar1;
  Fl_Double_Window *pFVar2;
  Fl_Group *pFVar3;
  Fl_Widget *pFVar4;
  Fl_Group *pFVar5;
  Fl_Menu_ *pFVar6;
  Fl_Button *pFVar7;
  Fl_Text_Editor *pFVar8;
  Fl_Text_Buffer *this;
  Fl_Window *this_00;
  
  pFVar2 = (Fl_Double_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window(pFVar2,0x157,0xed,"Binary Data Properties");
  data_panel = pFVar2;
  (pFVar2->super_Fl_Window).super_Fl_Group.super_Fl_Widget.label_.align_ = 0x50;
  pFVar3 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar3,10,10,0x10e,0x14,(char *)0x0);
  pFVar4 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar4,200,10,0x50,0x14,(char *)0x0);
  pFVar5 = Fl_Group::current();
  pFVar5->resizable_ = pFVar4;
  pFVar6 = (Fl_Menu_ *)operator_new(0x98);
  Fl_Choice::Fl_Choice((Fl_Choice *)pFVar6,10,10,0xb9,0x14,(char *)0x0);
  data_choice = (Fl_Choice *)pFVar6;
  pFVar6->down_box_ = '\x0e';
  (pFVar6->super_Fl_Widget).label_.size = 0xb;
  pFVar6->textsize_ = 0xb;
  Fl_Menu_::menu(pFVar6,menu_data_choice);
  pFVar6 = (Fl_Menu_ *)operator_new(0x98);
  Fl_Choice::Fl_Choice((Fl_Choice *)pFVar6,10,10,0x4b,0x14,(char *)0x0);
  data_class_choice = (Fl_Choice *)pFVar6;
  pFVar6->down_box_ = '\x0e';
  (pFVar6->super_Fl_Widget).label_.size = 0xb;
  pFVar6->textsize_ = 0xb;
  Fl_Menu_::menu(pFVar6,menu_data_class_choice);
  Fl_Group::end(pFVar3);
  pFVar4 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar4,10,0x34,0x140,0x14,"Variable Name:");
  data_input = (Fl_Input *)pFVar4;
  Fl_Widget::tooltip(pFVar4,"Binary Data variables are declared \"const unsigned char []\".");
  pFVar1 = data_input;
  (pFVar1->super_Fl_Input_).super_Fl_Widget.label_.font = 1;
  (pFVar1->super_Fl_Input_).super_Fl_Widget.label_.size = 0xb;
  (pFVar1->super_Fl_Input_).textfont_ = 4;
  (pFVar1->super_Fl_Input_).textsize_ = 0xb;
  (pFVar1->super_Fl_Input_).super_Fl_Widget.label_.align_ = 0x85;
  (pFVar1->super_Fl_Input_).super_Fl_Widget.when_ = '\0';
  pFVar4 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar4,10,0x5a,0x118,0x14,"Filename:");
  data_filename = (Fl_Input *)pFVar4;
  Fl_Widget::tooltip(pFVar4,"Name and path of binary file that will be included.");
  pFVar1 = data_filename;
  (pFVar1->super_Fl_Input_).super_Fl_Widget.label_.font = 1;
  (pFVar1->super_Fl_Input_).super_Fl_Widget.label_.size = 0xb;
  (pFVar1->super_Fl_Input_).textfont_ = 4;
  (pFVar1->super_Fl_Input_).textsize_ = 0xb;
  (pFVar1->super_Fl_Input_).super_Fl_Widget.label_.align_ = 0x85;
  (pFVar1->super_Fl_Input_).super_Fl_Widget.when_ = '\0';
  pFVar7 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar7,0x122,0x5a,0x28,0x14,"@fileopen");
  data_filebrowser = pFVar7;
  (pFVar7->super_Fl_Widget).label_.color = 0x86;
  pFVar8 = (Fl_Text_Editor *)operator_new(0x1c0);
  Fl_Text_Editor::Fl_Text_Editor(pFVar8,10,0x82,0x140,0x41,"Comment:");
  data_comment_input = pFVar8;
  Fl_Widget::tooltip((Fl_Widget *)pFVar8,"Declaration comment in Doxygen format");
  pFVar8 = data_comment_input;
  (data_comment_input->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.box_ = '\x03';
  (pFVar8->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.label_.font = 1;
  (pFVar8->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.label_.size = 0xb;
  (pFVar8->super_Fl_Text_Display).textfont_ = 4;
  (pFVar8->super_Fl_Text_Display).textsize_ = 0xb;
  (pFVar8->super_Fl_Text_Display).mColumnScale = 0.0;
  (pFVar8->super_Fl_Text_Display).super_Fl_Group.super_Fl_Widget.label_.align_ = 5;
  pFVar3 = Fl_Group::current();
  pFVar8 = data_comment_input;
  pFVar3->resizable_ = (Fl_Widget *)data_comment_input;
  this = (Fl_Text_Buffer *)operator_new(0x88);
  Fl_Text_Buffer::Fl_Text_Buffer(this,0,0x400);
  Fl_Text_Display::buffer(&pFVar8->super_Fl_Text_Display,this);
  Fl_Text_Editor::add_key_binding(data_comment_input,0xff09,0,use_tab_navigation);
  pFVar3 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar3,10,0xcd,0x140,0x14,(char *)0x0);
  pFVar4 = (Fl_Widget *)operator_new(0x80);
  Fl_Return_Button::Fl_Return_Button((Fl_Return_Button *)pFVar4,200,0xcd,0x3c,0x14,"OK");
  data_panel_ok = (Fl_Return_Button *)pFVar4;
  (pFVar4->label_).size = 0xb;
  this_00 = Fl_Widget::window(pFVar4);
  Fl_Window::hotspot(this_00,(Fl_Widget *)data_panel_ok,0);
  pFVar7 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar7,0x10e,0xcd,0x3c,0x14,"Cancel");
  data_panel_cancel = pFVar7;
  pFVar7->shortcut_ = 0xff1b;
  (pFVar7->super_Fl_Widget).label_.size = 0xb;
  pFVar4 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar4,10,0xcd,0xb9,0x14,(char *)0x0);
  pFVar5 = Fl_Group::current();
  pFVar5->resizable_ = pFVar4;
  Fl_Group::end(pFVar3);
  pFVar2 = data_panel;
  (pFVar2->super_Fl_Window).minw = 0x157;
  (pFVar2->super_Fl_Window).minh = 0xed;
  (pFVar2->super_Fl_Window).maxw = 0;
  (pFVar2->super_Fl_Window).maxh = 0;
  (pFVar2->super_Fl_Window).dw = 0;
  (pFVar2->super_Fl_Window).dh = 0;
  (pFVar2->super_Fl_Window).aspect = 0;
  Fl_Window::size_range_(&pFVar2->super_Fl_Window);
  Fl_Group::end((Fl_Group *)data_panel);
  return data_panel;
}

Assistant:

Fl_Double_Window* make_data_panel() {
  { data_panel = new Fl_Double_Window(343, 237, "Binary Data Properties");
    data_panel->align(Fl_Align(FL_ALIGN_CLIP|FL_ALIGN_INSIDE));
    { Fl_Group* o = new Fl_Group(10, 10, 270, 20);
      { Fl_Box* o = new Fl_Box(200, 10, 80, 20);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      { data_choice = new Fl_Choice(10, 10, 185, 20);
        data_choice->down_box(FL_BORDER_BOX);
        data_choice->labelsize(11);
        data_choice->textsize(11);
        data_choice->menu(menu_data_choice);
      } // Fl_Choice* data_choice
      { data_class_choice = new Fl_Choice(10, 10, 75, 20);
        data_class_choice->down_box(FL_BORDER_BOX);
        data_class_choice->labelsize(11);
        data_class_choice->textsize(11);
        data_class_choice->menu(menu_data_class_choice);
      } // Fl_Choice* data_class_choice
      o->end();
    } // Fl_Group* o
    { data_input = new Fl_Input(10, 52, 320, 20, "Variable Name:");
      data_input->tooltip("Binary Data variables are declared \"const unsigned char []\".");
      data_input->labelfont(1);
      data_input->labelsize(11);
      data_input->textfont(4);
      data_input->textsize(11);
      data_input->align(Fl_Align(133));
      data_input->when(FL_WHEN_NEVER);
    } // Fl_Input* data_input
    { data_filename = new Fl_Input(10, 90, 280, 20, "Filename:");
      data_filename->tooltip("Name and path of binary file that will be included.");
      data_filename->labelfont(1);
      data_filename->labelsize(11);
      data_filename->textfont(4);
      data_filename->textsize(11);
      data_filename->align(Fl_Align(133));
      data_filename->when(FL_WHEN_NEVER);
    } // Fl_Input* data_filename
    { data_filebrowser = new Fl_Button(290, 90, 40, 20, "@fileopen");
      data_filebrowser->labelcolor((Fl_Color)134);
    } // Fl_Button* data_filebrowser
    { data_comment_input = new Fl_Text_Editor(10, 130, 320, 65, "Comment:");
      data_comment_input->tooltip("Declaration comment in Doxygen format");
      data_comment_input->box(FL_DOWN_BOX);
      data_comment_input->labelfont(1);
      data_comment_input->labelsize(11);
      data_comment_input->textfont(4);
      data_comment_input->textsize(11);
      data_comment_input->align(Fl_Align(FL_ALIGN_TOP_LEFT));
      Fl_Group::current()->resizable(data_comment_input);
      data_comment_input->buffer(new Fl_Text_Buffer());
      data_comment_input->add_key_binding(FL_Tab, 0, use_tab_navigation);
    } // Fl_Text_Editor* data_comment_input
    { Fl_Group* o = new Fl_Group(10, 205, 320, 20);
      { data_panel_ok = new Fl_Return_Button(200, 205, 60, 20, "OK");
        data_panel_ok->labelsize(11);
        data_panel_ok->window()->hotspot(data_panel_ok);
      } // Fl_Return_Button* data_panel_ok
      { data_panel_cancel = new Fl_Button(270, 205, 60, 20, "Cancel");
        data_panel_cancel->shortcut(0xff1b);
        data_panel_cancel->labelsize(11);
      } // Fl_Button* data_panel_cancel
      { Fl_Box* o = new Fl_Box(10, 205, 185, 20);
        Fl_Group::current()->resizable(o);
      } // Fl_Box* o
      o->end();
    } // Fl_Group* o
    data_panel->size_range(343, 237);
    data_panel->end();
  } // Fl_Double_Window* data_panel
  return data_panel;
}